

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPointToArcTangents.cpp
# Opt level: O1

bool ParseTestPointToArcTangents(string *sString)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  double dVar2;
  size_type sVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ostream *poVar9;
  long *plVar10;
  char *pcVar11;
  char *__n;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var12;
  ulong __n_00;
  char *unaff_RBP;
  char *unaff_R12;
  pointer unaff_R14;
  char *unaff_R15;
  bool bVar13;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  double dVar14;
  undefined1 auVar15 [12];
  LLPoint tanPt1;
  string sTestId;
  string sTanPt1Lat;
  string sTan2Lat;
  LLPoint pt;
  string sTanPt2Lon;
  string sTanPt2Lat;
  string sTanPt1Lon;
  LLPoint tanPt2;
  int sub_matches [10];
  string sArcCenterLon;
  string sArcCenterLat;
  string sPointLon;
  string sPointLat;
  LLPoint arc;
  string sArcRadius;
  sregex_token_iterator it;
  sregex_token_iterator s_end;
  LLPoint local_548;
  undefined1 local_538 [16];
  undefined1 local_528 [16];
  char *local_510;
  long local_508;
  char local_500 [16];
  char *local_4f0;
  char *local_4e8;
  char local_4e0 [16];
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  char *local_428;
  ulong local_420;
  char local_418 [16];
  char *local_408;
  char *local_400;
  char local_3f8 [16];
  char *local_3e8;
  char *local_3e0;
  char local_3d8 [16];
  LLPoint local_3c8;
  string local_3b8;
  undefined8 local_398;
  undefined1 *local_388;
  long local_380;
  undefined1 local_378 [16];
  undefined1 *local_368;
  long local_360;
  undefined1 local_358 [16];
  undefined1 *local_348;
  long local_340;
  undefined1 local_338 [16];
  undefined1 *local_328;
  long local_320;
  undefined1 local_318 [16];
  undefined1 local_308 [32];
  char *local_2e8;
  undefined8 local_2e0;
  char local_2d8 [16];
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_2c8;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  double local_c0;
  undefined1 local_b8 [32];
  pointer local_98;
  pointer psStack_90;
  pointer local_88;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_80;
  pointer local_78;
  pointer piStack_70;
  pointer piStack_68;
  undefined1 uStack_60;
  undefined7 local_5f;
  undefined1 uStack_58;
  undefined8 uStack_57;
  size_t local_48;
  value_type *pvStack_40;
  bool local_38;
  
  lVar7 = std::__cxx11::string::find_last_not_of((char *)sString,0x15c234,0xffffffffffffffff);
  uVar8 = lVar7 + 1;
  if (sString->_M_string_length < uVar8) {
    auVar15 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase",uVar8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_4d0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)local_b8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_2c8);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_308);
    if (local_448._M_dataplus._M_p != unaff_R14) {
      operator_delete(local_448._M_dataplus._M_p);
    }
    if (auVar15._8_4_ != 1) {
      if (local_428 != unaff_R12) {
        operator_delete(local_428);
      }
      if (local_408 != unaff_R15) {
        operator_delete(local_408);
      }
      if (local_3e8 != unaff_RBP) {
        operator_delete(local_3e8);
      }
      if (local_4f0 != local_4e0) {
        operator_delete(local_4f0);
      }
      if (local_2e8 != local_2d8) {
        operator_delete(local_2e8);
      }
      if (local_388 != local_378) {
        operator_delete(local_388);
      }
      if (local_368 != local_358) {
        operator_delete(local_368);
      }
      if (local_348 != local_338) {
        operator_delete(local_348);
      }
      if (local_328 != local_318) {
        operator_delete(local_328);
      }
      if (local_510 != local_500) {
        operator_delete(local_510);
      }
      _Unwind_Resume(auVar15._0_8_);
    }
    plVar10 = (long *)__cxa_begin_catch(auVar15._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    pcVar11 = (char *)(**(code **)(*plVar10 + 0x10))(plVar10);
    std::operator<<((ostream *)&std::cout,pcVar11);
    __cxa_end_catch();
  }
  else {
    sString->_M_string_length = uVar8;
    (sString->_M_dataplus)._M_p[uVar8] = '\0';
    std::__cxx11::string::find_first_not_of((char *)sString,0x15c234,0);
    std::__cxx11::string::erase((ulong)sString,0);
    local_510 = local_500;
    local_508 = 0;
    local_500[0] = '\0';
    local_328 = local_318;
    local_320 = 0;
    local_318[0] = 0;
    local_348 = local_338;
    local_340 = 0;
    local_338[0] = 0;
    local_368 = local_358;
    local_360 = 0;
    local_358[0] = 0;
    local_388 = local_378;
    local_380 = 0;
    local_378[0] = 0;
    local_2e8 = local_2d8;
    local_2e0 = 0;
    local_2d8[0] = '\0';
    local_4f0 = local_4e0;
    local_4e8 = (char *)0x0;
    local_4e0[0] = '\0';
    unaff_RBP = local_3d8;
    local_3e0 = (char *)0x0;
    local_3d8[0] = '\0';
    unaff_R15 = local_3f8;
    local_400 = (char *)0x0;
    local_3f8[0] = '\0';
    unaff_R12 = local_418;
    local_420 = 0;
    local_418[0] = '\0';
    local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
    local_428 = unaff_R12;
    local_408 = unaff_R15;
    local_3e8 = unaff_RBP;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"([a-zA-Z]*\\d*)[,]","");
    std::__cxx11::string::append((char *)&local_448);
    std::__cxx11::string::append((char *)&local_448);
    std::__cxx11::string::append((char *)&local_448);
    std::__cxx11::string::append((char *)&local_448);
    std::__cxx11::string::append((char *)&local_448);
    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_308,&local_448,0x11);
    local_3b8.field_2._M_allocated_capacity = 0x600000005;
    local_3b8.field_2._8_8_ = 0x800000007;
    local_3b8._M_dataplus._M_p = (char *)0x200000001;
    local_3b8._M_string_length = 0x400000003;
    local_398 = 0xa00000009;
    _Var1._M_current = (sString->_M_dataplus)._M_p;
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
    ::regex_token_iterator<10ul>
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
                *)&local_2c8,_Var1,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(_Var1._M_current + sString->_M_string_length),(regex_type *)local_308,
               (int (*) [10])&local_3b8,0);
    uStack_58 = 0;
    uStack_57 = 0;
    piStack_68 = (pointer)0x0;
    uStack_60 = 0;
    local_5f = 0;
    local_78 = (pointer)0x0;
    piStack_70 = (pointer)0x0;
    local_88 = (pointer)0x0;
    _Stack_80._M_current = (char *)0x0;
    local_98 = (pointer)0x0;
    psStack_90 = (pointer)0x0;
    local_b8._16_8_ = (regex_type *)0x0;
    local_b8._24_8_ = 0;
    local_b8._0_8_ = (char *)0x0;
    local_b8._8_8_ = (char *)0x0;
    local_48 = 0;
    pvStack_40 = (value_type *)0x0;
    local_38 = false;
    bVar5 = std::__cxx11::
            regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
            ::operator==(&local_2c8,
                         (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                          *)local_b8);
    if (bVar5) {
      bVar5 = false;
    }
    else {
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_4d0,&local_2c8,0);
      local_548.latitude = (double)local_538;
      if ((local_4d0._M_result)->matched == true) {
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_548,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_548.longitude = 0.0;
        local_538[0] = 0;
      }
      std::__cxx11::string::operator=((string *)&local_510,(string *)&local_548);
      if ((undefined1 *)local_548.latitude != local_538) {
        operator_delete((void *)local_548.latitude);
      }
      if (local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_4d0._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_4d0,&local_2c8,0);
      if ((local_4d0._M_result)->matched == true) {
        local_548.latitude = (double)local_538;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_548,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_548.longitude = 0.0;
        local_538[0] = 0;
        local_548.latitude = (double)local_538;
      }
      std::__cxx11::string::operator=((string *)&local_328,(string *)&local_548);
      if ((undefined1 *)local_548.latitude != local_538) {
        operator_delete((void *)local_548.latitude);
      }
      if (local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_4d0._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_4d0,&local_2c8,0);
      if ((local_4d0._M_result)->matched == true) {
        local_548.latitude = (double)local_538;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_548,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_548.longitude = 0.0;
        local_538[0] = 0;
        local_548.latitude = (double)local_538;
      }
      std::__cxx11::string::operator=((string *)&local_348,(string *)&local_548);
      if ((undefined1 *)local_548.latitude != local_538) {
        operator_delete((void *)local_548.latitude);
      }
      if (local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_4d0._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_4d0,&local_2c8,0);
      if ((local_4d0._M_result)->matched == true) {
        local_548.latitude = (double)local_538;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_548,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_548.longitude = 0.0;
        local_538[0] = 0;
        local_548.latitude = (double)local_538;
      }
      std::__cxx11::string::operator=((string *)&local_368,(string *)&local_548);
      if ((undefined1 *)local_548.latitude != local_538) {
        operator_delete((void *)local_548.latitude);
      }
      if (local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_4d0._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_4d0,&local_2c8,0);
      if ((local_4d0._M_result)->matched == true) {
        local_548.latitude = (double)local_538;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_548,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_548.longitude = 0.0;
        local_538[0] = 0;
        local_548.latitude = (double)local_538;
      }
      std::__cxx11::string::operator=((string *)&local_388,(string *)&local_548);
      if ((undefined1 *)local_548.latitude != local_538) {
        operator_delete((void *)local_548.latitude);
      }
      if (local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_4d0._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_4d0,&local_2c8,0);
      if ((local_4d0._M_result)->matched == true) {
        local_548.latitude = (double)local_538;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_548,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_548.longitude = 0.0;
        local_538[0] = 0;
        local_548.latitude = (double)local_538;
      }
      std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_548);
      if ((undefined1 *)local_548.latitude != local_538) {
        operator_delete((void *)local_548.latitude);
      }
      if (local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_4d0._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_4d0,&local_2c8,0);
      if ((local_4d0._M_result)->matched == true) {
        local_548.latitude = (double)local_538;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_548,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_548.longitude = 0.0;
        local_538[0] = 0;
        local_548.latitude = (double)local_538;
      }
      std::__cxx11::string::operator=((string *)&local_4f0,(string *)&local_548);
      if ((undefined1 *)local_548.latitude != local_538) {
        operator_delete((void *)local_548.latitude);
      }
      if (local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_4d0._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_4d0,&local_2c8,0);
      if ((local_4d0._M_result)->matched == true) {
        local_548.latitude = (double)local_538;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_548,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_548.longitude = 0.0;
        local_538[0] = 0;
        local_548.latitude = (double)local_538;
      }
      std::__cxx11::string::operator=((string *)&local_3e8,(string *)&local_548);
      if ((undefined1 *)local_548.latitude != local_538) {
        operator_delete((void *)local_548.latitude);
      }
      if (local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_4d0._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_4d0,&local_2c8,0);
      if ((local_4d0._M_result)->matched == true) {
        local_548.latitude = (double)local_538;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_548,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_548.longitude = 0.0;
        local_538[0] = 0;
        local_548.latitude = (double)local_538;
      }
      std::__cxx11::string::operator=((string *)&local_408,(string *)&local_548);
      if ((undefined1 *)local_548.latitude != local_538) {
        operator_delete((void *)local_548.latitude);
      }
      if (local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_4d0._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::
      regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::operator++(&local_4d0,&local_2c8,0);
      if ((local_4d0._M_result)->matched == true) {
        local_548.latitude = (double)local_538;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_548,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   ((local_4d0._M_result)->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_548.longitude = 0.0;
        local_538[0] = 0;
        local_548.latitude = (double)local_538;
      }
      std::__cxx11::string::operator=((string *)&local_428,(string *)&local_548);
      if ((undefined1 *)local_548.latitude != local_538) {
        operator_delete((void *)local_548.latitude);
      }
      if (local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_4d0._M_position._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4d0._M_position._M_match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar5 = true;
    }
    if (local_78 != (pointer)0x0) {
      operator_delete(local_78);
    }
    if (local_98 != (pointer)0x0) {
      operator_delete(local_98);
    }
    if (local_2c8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2c8._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_2c8._M_position._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2c8._M_position._M_match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p);
    }
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_e0,local_328,local_328 + local_320);
    local_528._0_8_ = ParseLatitude(&local_e0);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_100,local_348,local_348 + local_340);
    local_448._M_string_length = (size_type)ParseLongitude(&local_100);
    local_448._M_dataplus._M_p = (pointer)((double)local_528._0_8_ * 0.017453292519943295);
    local_448._M_string_length =
         (size_type)((double)local_448._M_string_length * 0.017453292519943295);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_120,local_368,local_368 + local_360);
    dVar14 = ParseLatitude(&local_120);
    local_528._0_8_ = dVar14;
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_140,local_388,local_388 + local_380);
    local_308._8_8_ = ParseLongitude(&local_140);
    local_308._0_8_ = (double)local_528._0_8_ * 0.017453292519943295;
    local_308._8_8_ = (double)local_308._8_8_ * 0.017453292519943295;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    dVar14 = atof(local_2e8);
    local_528._0_8_ = dVar14;
    iVar6 = std::__cxx11::string::compare((char *)&local_4f0);
    if (iVar6 != 0) {
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,local_4f0,local_4e8 + (long)local_4f0);
      dVar14 = ParseLatitude(&local_160);
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      std::__cxx11::string::_M_construct<char*>
                (SUB84(dVar14,0),&local_180,local_3e8,local_3e0 + (long)local_3e8);
      ParseLongitude(&local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a0,local_408,local_400 + (long)local_408);
      dVar14 = ParseLatitude(&local_1a0);
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                (SUB84(dVar14,0),&local_1c0,local_428,local_428 + local_420);
      ParseLongitude(&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p);
      }
    }
    local_548.latitude = 0.0;
    local_548.longitude = 0.0;
    local_3c8.latitude = 0.0;
    local_3c8.longitude = 0.0;
    iVar6 = GeoCalcs::PointToArcTangents
                      ((LLPoint *)&local_448,(LLPoint *)local_308,(double)local_528._0_8_ * 1852.0,
                       &local_548,&local_3c8,1e-08);
    if (iVar6 != 0) {
      local_b8._0_8_ = local_548.latitude * 57.29577951308232;
      ConvertLatitudeDdToDms_abi_cxx11_((string *)&local_2c8,(double *)local_b8);
      local_4d0._M_position._M_begin._M_current = (char *)(local_548.longitude * 57.29577951308232);
      ConvertLongitudeDdToDms_abi_cxx11_((string *)local_b8,(double *)&local_4d0);
      local_3b8._M_dataplus._M_p = (pointer)(local_3c8.latitude * 57.29577951308232);
      ConvertLatitudeDdToDms_abi_cxx11_((string *)&local_4d0,(double *)&local_3b8);
      local_c0 = local_3c8.longitude * 57.29577951308232;
      ConvertLongitudeDdToDms_abi_cxx11_(&local_3b8,&local_c0);
      _Var1._M_current = local_2c8._M_position._M_end._M_current;
      pcVar11 = local_4e8;
      _Var12._M_current = local_2c8._M_position._M_end._M_current;
      if (local_4e8 < local_2c8._M_position._M_end._M_current) {
        _Var12._M_current = local_4e8;
      }
      if (_Var12._M_current == (char *)0x0) {
        bVar13 = true;
      }
      else {
        iVar6 = bcmp(local_2c8._M_position._M_begin._M_current,local_4f0,(size_t)_Var12._M_current);
        bVar13 = iVar6 == 0;
      }
      if (!(bool)(bVar13 & _Var1._M_current == pcVar11)) {
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e0,local_4f0,pcVar11 + (long)local_4f0);
        dVar14 = ParseLatitude(&local_1e0);
        dVar2 = dVar14 * 0.017453292519943295;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          local_528._8_4_ = extraout_XMM0_Dc;
          local_528._0_8_ = dVar14 * 0.017453292519943295;
          local_528._12_4_ = extraout_XMM0_Dd;
          operator_delete(local_1e0._M_dataplus._M_p);
          dVar2 = (double)local_528._0_8_;
        }
        dVar14 = ABS(local_548.latitude);
        if (ABS(dVar2) <= ABS(local_548.latitude)) {
          dVar14 = ABS(dVar2);
        }
        if (ABS(dVar2 - local_548.latitude) <= dVar14 * 1e-10) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_510,local_508);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," within rounding tolerance of ",0x1e);
          poVar9 = std::ostream::_M_insert<double>(1e-10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,": Input Tangent pt 1 latitude: ",0x1f);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_4f0,(long)local_4e8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  calced: ",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,local_2c8._M_position._M_begin._M_current,
                     (long)local_2c8._M_position._M_end._M_current);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_510,local_508);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," failed: Expected Tangent pt 1 latitude: ",0x29);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_4f0,(long)local_4e8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  calced: ",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,local_2c8._M_position._M_begin._M_current,
                     (long)local_2c8._M_position._M_end._M_current);
          bVar5 = false;
        }
      }
      uVar4 = local_b8._8_8_;
      pcVar11 = local_3e0;
      __n = (char *)local_b8._8_8_;
      if (local_3e0 < (ulong)local_b8._8_8_) {
        __n = local_3e0;
      }
      if (__n == (char *)0x0) {
        bVar13 = true;
      }
      else {
        iVar6 = bcmp((void *)local_b8._0_8_,local_3e8,(size_t)__n);
        bVar13 = iVar6 == 0;
      }
      if (!(bool)(bVar13 & (char *)uVar4 == pcVar11)) {
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_200,local_3e8,pcVar11 + (long)local_3e8);
        dVar14 = ParseLongitude(&local_200);
        dVar2 = dVar14 * 0.017453292519943295;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          local_528._8_4_ = extraout_XMM0_Dc_00;
          local_528._0_8_ = dVar14 * 0.017453292519943295;
          local_528._12_4_ = extraout_XMM0_Dd_00;
          operator_delete(local_200._M_dataplus._M_p);
          dVar2 = (double)local_528._0_8_;
        }
        dVar14 = ABS(local_548.longitude);
        if (ABS(dVar2) <= ABS(local_548.longitude)) {
          dVar14 = ABS(dVar2);
        }
        if (ABS(dVar2 - local_548.longitude) <= dVar14 * 1e-10) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_510,local_508);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," within rounding tolerance of ",0x1e);
          poVar9 = std::ostream::_M_insert<double>(1e-10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,": Input Tangent pt 1 longitude: ",0x20);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_3e8,(long)local_3e0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  calced: ",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,(char *)local_b8._0_8_,local_b8._8_8_);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_510,local_508);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," failed: Expected Tangent pt 1 longitude: ",0x2a);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_3e8,(long)local_3e0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  calced: ",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,(char *)local_b8._0_8_,local_b8._8_8_);
          bVar5 = false;
        }
      }
      pcVar11 = local_400;
      _Var1._M_current = local_4d0._M_position._M_end._M_current;
      _Var12._M_current = local_4d0._M_position._M_end._M_current;
      if (local_400 < local_4d0._M_position._M_end._M_current) {
        _Var12._M_current = local_400;
      }
      if (_Var12._M_current == (char *)0x0) {
        bVar13 = true;
      }
      else {
        iVar6 = bcmp(local_4d0._M_position._M_begin._M_current,local_408,(size_t)_Var12._M_current);
        bVar13 = iVar6 == 0;
      }
      if (!(bool)(bVar13 & _Var1._M_current == pcVar11)) {
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_220,local_408,pcVar11 + (long)local_408);
        dVar14 = ParseLatitude(&local_220);
        dVar2 = dVar14 * 0.017453292519943295;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          local_528._8_4_ = extraout_XMM0_Dc_01;
          local_528._0_8_ = dVar14 * 0.017453292519943295;
          local_528._12_4_ = extraout_XMM0_Dd_01;
          operator_delete(local_220._M_dataplus._M_p);
          dVar2 = (double)local_528._0_8_;
        }
        dVar14 = ABS(local_3c8.latitude);
        if (ABS(dVar2) <= ABS(local_3c8.latitude)) {
          dVar14 = ABS(dVar2);
        }
        if (ABS(dVar2 - local_3c8.latitude) <= dVar14 * 1e-10) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_510,local_508);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," within rounding tolerance of ",0x1e);
          poVar9 = std::ostream::_M_insert<double>(1e-10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,": Input Tangent pt 2 latitude: ",0x1f);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_408,(long)local_400);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  calced: ",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,local_4d0._M_position._M_begin._M_current,
                     (long)local_4d0._M_position._M_end._M_current);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_510,local_508);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," failed: Expected Tangent pt 2 latitude: ",0x29);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_408,(long)local_400);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  calced: ",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,local_4d0._M_position._M_begin._M_current,
                     (long)local_4d0._M_position._M_end._M_current);
          bVar5 = false;
        }
      }
      sVar3 = local_3b8._M_string_length;
      uVar8 = local_420;
      __n_00 = local_3b8._M_string_length;
      if (local_420 < local_3b8._M_string_length) {
        __n_00 = local_420;
      }
      if (__n_00 == 0) {
        bVar13 = true;
      }
      else {
        iVar6 = bcmp(local_3b8._M_dataplus._M_p,local_428,__n_00);
        bVar13 = iVar6 == 0;
      }
      if (!(bool)(bVar13 & sVar3 == uVar8)) {
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_240,local_428,local_428 + uVar8);
        dVar14 = ParseLongitude(&local_240);
        dVar2 = dVar14 * 0.017453292519943295;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          local_528._8_4_ = extraout_XMM0_Dc_02;
          local_528._0_8_ = dVar14 * 0.017453292519943295;
          local_528._12_4_ = extraout_XMM0_Dd_02;
          operator_delete(local_240._M_dataplus._M_p);
          dVar2 = (double)local_528._0_8_;
        }
        dVar14 = ABS(local_3c8.longitude);
        if (ABS(dVar2) <= ABS(local_3c8.longitude)) {
          dVar14 = ABS(dVar2);
        }
        if (ABS(dVar2 - local_3c8.longitude) <= dVar14 * 1e-10) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_510,local_508);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," within rounding tolerance of ",0x1e);
          poVar9 = std::ostream::_M_insert<double>(1e-10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,": Input Tangent pt 2 longitude: ",0x20);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_428,local_420);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  calced: ",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,local_3b8._M_dataplus._M_p,local_3b8._M_string_length);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_510,local_508);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," failed: Expected Tangent pt 2 longitude: ",0x2a);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_428,local_420);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  calced: ",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,local_3b8._M_dataplus._M_p,local_3b8._M_string_length);
          bVar5 = false;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
        operator_delete(local_3b8._M_dataplus._M_p);
      }
      if ((regex_type **)local_4d0._M_position._M_begin._M_current !=
          &local_4d0._M_position._M_pregex) {
        operator_delete(local_4d0._M_position._M_begin._M_current);
      }
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_);
      }
      if ((regex_type **)local_2c8._M_position._M_begin._M_current !=
          &local_2c8._M_position._M_pregex) {
        operator_delete(local_2c8._M_position._M_begin._M_current);
      }
      goto LAB_00150bbd;
    }
    iVar6 = std::__cxx11::string::compare((char *)&local_4f0);
    if (iVar6 == 0) goto LAB_00150bbd;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_510,local_508);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9," Failed: Returned with no solution.",0x23);
  }
  bVar5 = false;
LAB_00150bbd:
  if (local_428 != unaff_R12) {
    operator_delete(local_428);
  }
  if (local_408 != unaff_R15) {
    operator_delete(local_408);
  }
  if (local_3e8 != unaff_RBP) {
    operator_delete(local_3e8);
  }
  if (local_4f0 != local_4e0) {
    operator_delete(local_4f0);
  }
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8);
  }
  if (local_388 != local_378) {
    operator_delete(local_388);
  }
  if (local_368 != local_358) {
    operator_delete(local_368);
  }
  if (local_348 != local_338) {
    operator_delete(local_348);
  }
  if (local_328 != local_318) {
    operator_delete(local_328);
  }
  if (local_510 != local_500) {
    operator_delete(local_510);
  }
  return bVar5;
}

Assistant:

bool ParseTestPointToArcTangents(string sString)
{
    bool bPassed = false;
    trim(sString);
    string sTestId, sPointLat, sPointLon, sArcCenterLat, sArcCenterLon, sArcRadius;
    string sTanPt1Lat, sTanPt1Lon, sTanPt2Lat, sTanPt2Lon;
    try
    {
        regex_constants::syntax_option_type flags = regex_constants::icase | regex_constants::ECMAScript;

        string sRxPat = "([a-zA-Z]*\\d*)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])";

        regex pat(sRxPat, flags);

        int const sub_matches[] = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10,};
        sregex_token_iterator it(sString.begin(), sString.end(), pat, sub_matches);
        sregex_token_iterator s_end;
        if (it != s_end)
        {
            sTestId = *it++;
            sPointLat = *it++;
            sPointLon = *it++;
            sArcCenterLat = *it++;
            sArcCenterLon = *it++;
            sArcRadius = *it++;
            sTanPt1Lat = *it++;
            sTanPt1Lon = *it++;
            sTanPt2Lat = *it++;
            sTanPt2Lon = *it++;
            bPassed = true;
        }
    }
    catch (regex_error &e)
    {
        cout << "\n" << e.what();
        return false;
    }

    LLPoint pt(Deg2Rad(ParseLatitude(sPointLat)), Deg2Rad(ParseLongitude(sPointLon)));
    LLPoint arc(Deg2Rad(ParseLatitude(sArcCenterLat)), Deg2Rad(ParseLongitude(sArcCenterLon)));
    double radius = NmToMeters(atof(sArcRadius.c_str()));

    LLPoint tangentPt1;
    LLPoint tangentPt2;

    if (sTanPt1Lat.compare("N/A") != 0)
    {
        tangentPt1.Set(Deg2Rad(ParseLatitude(sTanPt1Lat)), Deg2Rad(ParseLongitude(sTanPt1Lon)));
        tangentPt2.Set(Deg2Rad(ParseLatitude(sTanPt2Lat)), Deg2Rad(ParseLongitude(sTanPt2Lon)));
    }

    LLPoint tanPt1, tanPt2;

    int nIndex = PointToArcTangents(pt, arc, radius, tanPt1, tanPt2, 1e-8);

    if (nIndex == 0)
    {
        if (sTanPt1Lat.compare("N/A") != 0)
        {
            bPassed = false;
            cout << "\n" << sTestId << " Failed: Returned with no solution.";
        }

    }
    else
    {

        string sTan1Lat = ConvertLatitudeDdToDms(Rad2Deg(tanPt1.latitude));
        string sTan1Lon = ConvertLongitudeDdToDms(Rad2Deg(tanPt1.longitude));
        string sTan2Lat = ConvertLatitudeDdToDms(Rad2Deg(tanPt2.latitude));
        string sTan2Lon = ConvertLongitudeDdToDms(Rad2Deg(tanPt2.longitude));

        double dTol = 1e-10;
        if (sTan1Lat.compare(sTanPt1Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(sTanPt1Lat));
            if (IsApprox(dLat, tanPt1.latitude, dTol))
            {
                cout << "\n" << sTestId << " within rounding tolerance of " << dTol <<
                ": Input Tangent pt 1 latitude: " << sTanPt1Lat << "  calced: " << sTan1Lat;
            }
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tangent pt 1 latitude: " << sTanPt1Lat << "  calced: " <<
                sTan1Lat;
                bPassed = false;
            }
        }

        if (sTan1Lon.compare(sTanPt1Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLongitude(sTanPt1Lon));
            if (IsApprox(dLon, tanPt1.longitude, dTol))
            {
                cout << "\n" << sTestId << " within rounding tolerance of " << dTol <<
                ": Input Tangent pt 1 longitude: " << sTanPt1Lon << "  calced: " << sTan1Lon;
            }
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tangent pt 1 longitude: " << sTanPt1Lon << "  calced: " <<
                sTan1Lon;
                bPassed = false;
            }
        }

        if (sTan2Lat.compare(sTanPt2Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(sTanPt2Lat));
            if (IsApprox(dLat, tanPt2.latitude, dTol))
            {
                cout << "\n" << sTestId << " within rounding tolerance of " << dTol <<
                ": Input Tangent pt 2 latitude: " << sTanPt2Lat << "  calced: " << sTan2Lat;
            }
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tangent pt 2 latitude: " << sTanPt2Lat << "  calced: " <<
                sTan2Lat;
                bPassed = false;
            }
        }

        if (sTan2Lon.compare(sTanPt2Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLongitude(sTanPt2Lon));
            if (IsApprox(dLon, tanPt2.longitude, dTol))
            {
                cout << "\n" << sTestId << " within rounding tolerance of " << dTol <<
                ": Input Tangent pt 2 longitude: " << sTanPt2Lon << "  calced: " << sTan2Lon;
            }
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tangent pt 2 longitude: " << sTanPt2Lon << "  calced: " <<
                sTan2Lon;
                bPassed = false;
            }
        }


    }


    return bPassed;
}